

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  ID_index IVar1;
  bool bVar2;
  stored_size_type sVar3;
  reference ppEVar4;
  pointer ppEVar5;
  const_iterator it2;
  const_iterator it1;
  vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
  local_38;
  vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
  local_30;
  
  if (c1 == c2) {
    return true;
  }
  sVar3 = (c1->column_).
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size;
  if (sVar3 == (c2->column_).
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size) {
    ppEVar5 = (c1->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    local_38.m_ptr =
         (c2->column_).
         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
         .super_type.m_holder.m_start;
    local_30.m_ptr = ppEVar5;
    while ((bVar2 = true, local_30.m_ptr != ppEVar5 + sVar3 &&
           (local_38.m_ptr !=
            (c2->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_start +
            (c2->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size))) {
      ppEVar4 = boost::container::
                vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
                ::operator*(&local_30);
      IVar1 = (*ppEVar4)->rowIndex_;
      ppEVar4 = boost::container::
                vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
                ::operator*(&local_38);
      if (IVar1 != (*ppEVar4)->rowIndex_) goto LAB_0015b2f2;
      boost::container::
      vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
      ::operator++(&local_30);
      boost::container::
      vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_**,_true>
      ::operator++(&local_38);
      ppEVar5 = (c1->column_).
                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                .super_type.m_holder.m_start;
      sVar3 = (c1->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
    }
  }
  else {
LAB_0015b2f2:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }